

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampGetTexParameterIErrors.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TextureBorderClampGetTexParameterIErrorsTest::iterate
          (TextureBorderClampGetTexParameterIErrorsTest *this)

{
  char *description;
  bool bVar1;
  
  (*(this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[5])();
  CheckAllNames(this,0x8513,0);
  CheckAllNames(this,0x8515,0x500);
  if ((this->super_TextureBorderClampBase).super_TestCaseBase.m_is_texture_buffer_supported == true)
  {
    CheckAllNames(this,0x8c2a,0x500);
  }
  bVar1 = this->m_test_passed == '\0';
  if (bVar1) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.super_TestNode.
             m_testCtx,(uint)bVar1,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBorderClampGetTexParameterIErrorsTest::iterate(void)
{
	initTest();

	/* Make sure the tested functions report GL_NO_ERROR if used with
	 * cube map texture target. */
	CheckAllNames(GL_TEXTURE_CUBE_MAP, GL_NO_ERROR);

	/* Make sure the tested functions report GL_INVALID_ENUM error
	 * if used for cube-map face texture targets. */
	CheckAllNames(GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_INVALID_ENUM);

	if (m_is_texture_buffer_supported)
	{
		/* Make sure the tested functions report GL_INVALID_ENUM error
		 * if used for GL_TEXTURE_BUFFER_EXT texture target. */
		CheckAllNames(GL_TEXTURE_BUFFER_EXT, GL_INVALID_ENUM);
	}

	if (m_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}